

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

bool XipFile::isXipFile(ReadWriter_ptr *r,uint32_t rvabase)

{
  uint32_t uVar1;
  uint32_t uVar2;
  element_type *peVar3;
  uint local_28;
  uint32_t physfirst;
  uint32_t hdrofs;
  uint32_t hdrrva;
  uint32_t ecec;
  uint32_t rvabase_local;
  ReadWriter_ptr *r_local;
  
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)r
                     );
  (*peVar3->_vptr_ReadWriter[4])(peVar3,0x40);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)r
                     );
  uVar1 = ReadWriter::read32le(peVar3);
  if (uVar1 == 0x43454345) {
    peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )r);
    uVar1 = ReadWriter::read32le(peVar3);
    peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )r);
    local_28 = ReadWriter::read32le(peVar3);
    if ((uVar1 == 0) && (local_28 == 0)) {
      if (1 < g_verbose) {
        printf("not xip: hdrofs=0x%x\n",0);
      }
      r_local._7_1_ = false;
    }
    else {
      if ((rvabase != 0) && (local_28 == 0)) {
        local_28 = uVar1 - rvabase;
      }
      peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)r);
      (*peVar3->_vptr_ReadWriter[4])(peVar3,(ulong)(local_28 + 8));
      peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)r);
      uVar2 = ReadWriter::read32le(peVar3);
      if (uVar2 == uVar1 - local_28) {
        r_local._7_1_ = true;
      }
      else {
        if (1 < g_verbose) {
          printf("not xip: p1(0x%x) != hrva(0x%x)-hofs(0x%x) == 0x%x\n",(ulong)uVar2,(ulong)uVar1,
                 (ulong)local_28,(ulong)(uVar1 - local_28));
        }
        r_local._7_1_ = false;
      }
    }
  }
  else {
    if (1 < g_verbose) {
      printf("not xip: ecec=0x%x\n",(ulong)uVar1);
    }
    r_local._7_1_ = false;
  }
  return r_local._7_1_;
}

Assistant:

static bool isXipFile(ReadWriter_ptr r, uint32_t rvabase)
    {
        r->setpos(0x40);
        uint32_t ecec= r->read32le();
        if (ecec!=0x43454345) {
            if (g_verbose > 1)
                printf("not xip: ecec=0x%x\n", ecec);
            return false;
        }
        uint32_t hdrrva= r->read32le();
        uint32_t hdrofs= r->read32le();
        if (hdrrva==0 && hdrofs==0) {
            if (g_verbose > 1)
                printf("not xip: hdrofs=0x%x\n", hdrofs);
            return false;
        }
        if (rvabase && hdrofs==0)
            hdrofs= hdrrva-rvabase;
        else if (rvabase==0)
            rvabase= hdrrva-hdrofs;

        r->setpos(hdrofs+8);
        uint32_t physfirst= r->read32le();

        if (physfirst != hdrrva-hdrofs) {
            if (g_verbose > 1)
                printf("not xip: p1(0x%x) != hrva(0x%x)-hofs(0x%x) == 0x%x\n", physfirst, hdrrva, hdrofs, hdrrva-hdrofs);
            return false;
        }

        return true;
    }